

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# awssyncer.cc
# Opt level: O2

int main(void)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  PosixCommandRunner posix_runner;
  RecursiveInotifyPoller rip;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> path;
  FilesystemDirt dirt;
  string local_path;
  string sync_excludes_str;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sync_excludes;
  optional<InotifyEvent> event;
  string filter_regex;
  string s3_bucket;
  PeriodicFilesystemDirtier periodic_dirtier;
  AwsCommandRunner runner;
  FilteringInotifyPoller fip;
  stat sStack_10178;
  MultipleCommandRunner multiple_command_runner;
  NonrecursiveInotifyPoller nip;
  
  std::__cxx11::string::string((string *)&nip,"LOCAL_PATH",(allocator *)&sStack_10178);
  GetEnvironmentVariable(&local_path,(string *)&nip);
  std::__cxx11::string::~string((string *)&nip);
  std::__cxx11::string::string((string *)&nip,"S3_BUCKET",(allocator *)&sStack_10178);
  GetEnvironmentVariable(&s3_bucket,(string *)&nip);
  std::__cxx11::string::~string((string *)&nip);
  std::__cxx11::string::string((string *)&nip,"FILTER_REGEX",(allocator *)&sStack_10178);
  GetEnvironmentVariable(&filter_regex,(string *)&nip);
  std::__cxx11::string::~string((string *)&nip);
  std::__cxx11::string::string((string *)&nip,"SYNC_EXCLUDES",(allocator *)&sStack_10178);
  GetEnvironmentVariable(&sync_excludes_str,(string *)&nip);
  std::__cxx11::string::~string((string *)&nip);
  sync_excludes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sync_excludes._M_t._M_impl.super__Rb_tree_header._M_header;
  sync_excludes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sync_excludes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sync_excludes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sync_excludes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sync_excludes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (lVar3 = std::__cxx11::string::find((char)&sync_excludes_str,0x7c), lVar3 != -1) {
    std::__cxx11::string::substr((ulong)&nip,(ulong)&sync_excludes_str);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&sync_excludes,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nip);
    std::__cxx11::string::~string((string *)&nip);
    std::__cxx11::string::erase((ulong)&sync_excludes_str,0);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sync_excludes,&sync_excludes_str);
  do {
    NonrecursiveInotifyPoller::NonrecursiveInotifyPoller(&nip);
    FilteringInotifyPoller::FilteringInotifyPoller(&fip,&nip.super_InotifyPoller,&filter_regex);
    rip.super_InotifyPoller._vptr_InotifyPoller = (_func_int **)&PTR__InotifyPoller_0013cd30;
    rip.ip_ = &fip.super_InotifyPoller;
    bVar1 = RecursiveInotifyPoller::AddWatch(&rip,&local_path);
    if (!bVar1) {
      __assert_fail("res",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/awssyncer.cc"
                    ,0x5a,
                    "void RunSyncer(const std::string &, const std::string &, const std::string &, const std::set<std::string> &)"
                   );
    }
    dirt.dirty_ = false;
    dirt.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    dirt.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    dirt.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &dirt.children_._M_t._M_impl.super__Rb_tree_header._M_header;
    dirt.children_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    dirt.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         dirt.children_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    PeriodicFilesystemDirtier::PeriodicFilesystemDirtier
              (&periodic_dirtier,&dirt,&local_path,(duration)0x13a52453c000);
    posix_runner.super_CommandRunner._vptr_CommandRunner =
         (_func_int **)&PTR__PosixCommandRunner_0013ccd0;
    posix_runner.current_process_ = -1;
    posix_runner.previous_command_failed_ = false;
    MultipleCommandRunner::MultipleCommandRunner
              (&multiple_command_runner,&posix_runner.super_CommandRunner);
    AwsCommandRunner::AwsCommandRunner
              (&runner,&multiple_command_runner,&local_path,&s3_bucket,&sync_excludes);
    while( true ) {
      event.super__Optional_base<InotifyEvent,_true>._M_engaged = false;
      while( true ) {
        (*rip.super_InotifyPoller._vptr_InotifyPoller[3])(&sStack_10178,&rip);
        std::experimental::fundamentals_v1::_Optional_base<InotifyEvent,_true>::operator=
                  (&event.super__Optional_base<InotifyEvent,_true>,
                   (_Optional_base<InotifyEvent,_true> *)&sStack_10178);
        bVar1 = event.super__Optional_base<InotifyEvent,_true>._M_engaged;
        std::experimental::fundamentals_v1::_Optional_base<InotifyEvent,_true>::~_Optional_base
                  ((_Optional_base<InotifyEvent,_true> *)&sStack_10178);
        if (bVar1 != true) break;
        FilesystemDirt::AddDirtyPath
                  (&dirt,&event.super__Optional_base<InotifyEvent,_true>.field_0._M_payload.path);
      }
      iVar2 = (*rip.super_InotifyPoller._vptr_InotifyPoller[4])(&rip);
      if ((char)iVar2 != '\0') break;
      PeriodicFilesystemDirtier::Tick(&periodic_dirtier);
      bVar1 = AwsCommandRunner::Finished(&runner);
      if (bVar1) {
        bVar1 = AwsCommandRunner::PreviousCommandFailed(&runner);
        if (bVar1) {
          poVar4 = Log();
          pcVar6 = "Failed to execute command";
          goto LAB_00120c45;
        }
        FilesystemDirt::ExtractDirtyPath_abi_cxx11_(&path,&dirt);
        if (path.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_engaged == true) {
          poVar4 = Log();
          poVar4 = std::operator<<(poVar4,"Processing path ");
          poVar4 = std::operator<<(poVar4,(string *)&path);
          std::endl<char,std::char_traits<char>>(poVar4);
          iVar2 = lstat((char *)path.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                .field_0._M_payload._M_dataplus._M_p,&sStack_10178);
          if (iVar2 == 0) {
            if ((sStack_10178.st_mode & 0xf000) == 0x4000) {
              AwsCommandRunner::SyncDirectory(&runner,(string *)&path);
            }
          }
          else {
            piVar5 = __errno_location();
            if (*piVar5 != 2) {
              poVar4 = Log();
              poVar4 = std::operator<<(poVar4,"Failed to stat ");
              poVar4 = std::operator<<(poVar4,(string *)&path);
              std::endl<char,std::char_traits<char>>(poVar4);
              std::experimental::fundamentals_v1::
              _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::~_Optional_base(&path.
                                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               );
              goto LAB_00120c55;
            }
            AwsCommandRunner::Remove(&runner,(string *)&path);
          }
        }
        std::experimental::fundamentals_v1::
        _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::~_Optional_base(&path.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         );
      }
      std::experimental::fundamentals_v1::_Optional_base<InotifyEvent,_true>::~_Optional_base
                (&event.super__Optional_base<InotifyEvent,_true>);
      sStack_10178.st_dev = 1;
      std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                ((duration<long,_std::ratio<1L,_1L>_> *)&sStack_10178);
    }
    poVar4 = Log();
    pcVar6 = "Inotify dropped events";
LAB_00120c45:
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
LAB_00120c55:
    std::experimental::fundamentals_v1::_Optional_base<InotifyEvent,_true>::~_Optional_base
              (&event.super__Optional_base<InotifyEvent,_true>);
    AwsCommandRunner::~AwsCommandRunner(&runner);
    std::
    deque<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
    ::~deque(&multiple_command_runner.enqueued_commands_.c);
    PosixCommandRunner::~PosixCommandRunner(&posix_runner);
    std::__cxx11::string::~string((string *)&periodic_dirtier.path_);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>_>
    ::~_Rb_tree(&dirt.children_._M_t);
    FilteringInotifyPoller::~FilteringInotifyPoller(&fip);
    NonrecursiveInotifyPoller::~NonrecursiveInotifyPoller(&nip);
    poVar4 = Log();
    poVar4 = std::operator<<(poVar4,"Restarting in five seconds");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>((duration<long,_std::ratio<1L,_1L>_> *)&nip)
    ;
  } while( true );
}

Assistant:

int main() {
  // Obtain configuration from environment variables.
  std::string local_path = GetEnvironmentVariable("LOCAL_PATH");
  std::string s3_bucket = GetEnvironmentVariable("S3_BUCKET");
  std::string filter_regex = GetEnvironmentVariable("FILTER_REGEX");
  std::string sync_excludes_str = GetEnvironmentVariable("SYNC_EXCLUDES");

  // Convert single string of globs into a list by splitting on the '|',
  // for example: "*.jpg|*.mp3" -> {"*.jpg", "*.mp3"}.
  std::set<std::string> sync_excludes;
  for (;;) {
    std::size_t split = sync_excludes_str.find('|');
    if (split != std::string::npos) {
      sync_excludes.insert(sync_excludes_str.substr(0, split));
      sync_excludes_str.erase(0, split + 1);
    } else {
      sync_excludes.insert(sync_excludes_str);
      break;
    }
  }

  // Keep on running indefinitely, restarting if an error occurred. Put a pause
  // of a couple of seconds in between, so that we never perform any actions in
  // a tight loop.
  for (;;) {
    RunSyncer(local_path, s3_bucket, filter_regex, sync_excludes);
    Log() << "Restarting in five seconds" << std::endl;
    std::this_thread::sleep_for(std::chrono::seconds(5));
  }
}